

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void __thiscall tcu::astc::anon_unknown_0::ASTCBlockMode::ASTCBlockMode(ASTCBlockMode *this)

{
  ASTCBlockMode *this_local;
  
  this->isError = true;
  this->isVoidExtent = true;
  this->isDualPlane = true;
  this->weightGridWidth = -1;
  this->weightGridHeight = -1;
  ISEParams::ISEParams(&this->weightISEParams,ISEMODE_LAST,-1);
  return;
}

Assistant:

ASTCBlockMode (void)
		: isError			(true)
		, isVoidExtent		(true)
		, isDualPlane		(true)
		, weightGridWidth	(-1)
		, weightGridHeight	(-1)
		, weightISEParams	(ISEMODE_LAST, -1)
	{
	}